

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_module_decl(gvisitor_t *self,gnode_module_decl_t *node)

{
  ulong *puVar1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  gnode_t *pgVar7;
  size_t sVar8;
  
  puVar1 = *self->data;
  if (puVar1 == (ulong *)0x0) {
    uVar5 = 0xffffffffffffffff;
  }
  else {
    uVar5 = *puVar1 - 1;
  }
  if (uVar5 < *puVar1) {
    pgVar7 = *(gnode_t **)((puVar1[2] - 8) + *puVar1 * 8);
  }
  else {
    pgVar7 = (gnode_t *)0x0;
  }
  node->env = pgVar7;
  if (pgVar7->tag != NODE_LIST_STAT) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Module %s cannot be declared here.",
                 node->identifier);
  }
  check_access_storage_specifiers(self,&node->base,pgVar7->tag,node->access,node->storage);
  plVar2 = *self->data;
  lVar3 = plVar2[1];
  if (*plVar2 == lVar3) {
    lVar6 = 8;
    if (lVar3 != 0) {
      lVar6 = lVar3 * 2;
    }
    plVar2[1] = lVar6;
    pvVar4 = realloc((void *)plVar2[2],lVar6 << 3);
    *(void **)(*self->data + 0x10) = pvVar4;
  }
  plVar2 = *self->data;
  lVar3 = *plVar2;
  *plVar2 = lVar3 + 1;
  *(gnode_module_decl_t **)(plVar2[2] + lVar3 * 8) = node;
  if (node->decls == (gnode_r *)0x0) {
    sVar8 = 0;
  }
  else {
    sVar8 = node->decls->n;
  }
  if (sVar8 != 0) {
    uVar5 = 0;
    do {
      if (uVar5 < node->decls->n) {
        pgVar7 = node->decls->p[uVar5];
      }
      else {
        pgVar7 = (gnode_t *)0x0;
      }
      gvisit(self,pgVar7);
      uVar5 = uVar5 + 1;
    } while (sVar8 != uVar5);
  }
  lVar3 = **self->data;
  if (lVar3 != 0) {
    **self->data = lVar3 + -1;
  }
  return;
}

Assistant:

static void visit_module_decl (gvisitor_t *self, gnode_module_decl_t *node) {
    #pragma unused(self, node)
    DEBUG_CODEGEN("visit_module_decl %s", node->identifier);

    // a module should be like a class with static entries
    // instantiated with import

//    gravity_module_t *module = gravity_module_new(GET_VM(), node->identifier);
//    CONTEXT_PUSH(module);
//
//    // process inner declarations
//    gnode_array_each(node->decls, {visit(val);});
//
//    // adjust declaration stack
//    CONTEXT_POP();
}